

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedSyncDrawIndirect::Run(AdvancedSyncDrawIndirect *this)

{
  bool bVar1;
  GLuint GVar2;
  int w;
  int h;
  Vector<float,_4> local_40;
  char *local_30;
  char *glsl_draw_fs;
  char *glsl_draw_vs;
  char *glsl_store_vs;
  AdvancedSyncDrawIndirect *this_local;
  
  glsl_store_vs = (char *)this;
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,1);
  if (bVar1) {
    glsl_draw_vs = 
    "#version 420 core\nwriteonly uniform uimageBuffer g_draw_command_buffer;\nvoid main() {\n  imageStore(g_draw_command_buffer, 0, uvec4(4, 1, 0, 0));\n}"
    ;
    glsl_draw_fs = 
    "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
    ;
    local_30 = 
    "#version 420 core\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
    ;
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nwriteonly uniform uimageBuffer g_draw_command_buffer;\nvoid main() {\n  imageStore(g_draw_command_buffer, 0, uvec4(4, 1, 0, 0));\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(bool *)0x0);
    this->m_store_program = GVar2;
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,
                       "#version 420 core\nlayout(location = 0) out vec4 o_color;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n}"
                       ,(bool *)0x0);
    this->m_draw_program = GVar2;
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_draw_command_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->m_draw_command_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0x10,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0);
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_draw_command_buffer_tex);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_draw_command_buffer_tex);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8d70,this->m_draw_command_buffer);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_attribless_vao);
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_draw_vao,&this->m_draw_vbo,
               (GLuint *)0x0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_draw_command_buffer_tex,0,'\0',0,0x88ba,0x8d70);
    glu::CallLogWrapper::glEnable
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_store_program);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_attribless_vao);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,1);
    glu::CallLogWrapper::glDisable
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c89);
    glu::CallLogWrapper::glClear
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_draw_vao);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,this->m_draw_command_buffer);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x40);
    glu::CallLogWrapper::glDrawArraysIndirect
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,(void *)0x0);
    w = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
    h = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
    tcu::Vector<float,_4>::Vector(&local_40,0.0,1.0,0.0,1.0);
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,0,0,w,h,&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = (AdvancedSyncDrawIndirect *)0x0;
    }
    else {
      this_local = (AdvancedSyncDrawIndirect *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedSyncDrawIndirect *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		const char* const glsl_store_vs =
			"#version 420 core" NL "writeonly uniform uimageBuffer g_draw_command_buffer;" NL "void main() {" NL
			"  imageStore(g_draw_command_buffer, 0, uvec4(4, 1, 0, 0));" NL "}";
		const char* const glsl_draw_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
										 "void main() {" NL "  gl_Position = i_position;" NL "}";
		const char* const glsl_draw_fs = "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL
										 "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL "}";
		m_store_program = BuildProgram(glsl_store_vs, NULL, NULL, NULL, NULL);
		m_draw_program  = BuildProgram(glsl_draw_vs, NULL, NULL, NULL, glsl_draw_fs);

		glGenBuffers(1, &m_draw_command_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_command_buffer);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(uvec4), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, 0);

		glGenTextures(1, &m_draw_command_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_draw_command_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32UI, m_draw_command_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenVertexArrays(1, &m_attribless_vao);
		CreateFullViewportQuad(&m_draw_vao, &m_draw_vbo, NULL);

		glBindImageTexture(0, m_draw_command_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32UI);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_store_program);
		glBindVertexArray(m_attribless_vao);
		glDrawArrays(GL_POINTS, 0, 1);

		glDisable(GL_RASTERIZER_DISCARD);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_draw_vao);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_command_buffer);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT);
		glDrawArraysIndirect(GL_TRIANGLE_STRIP, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}